

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O2

int BIO_read_asn1(BIO *bio,uint8_t **out,size_t *out_len,size_t max_len)

{
  int iVar1;
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __n;
  int line;
  uint uVar7;
  size_t sVar8;
  bool bVar9;
  uint8_t header [6];
  int eof_on_first_read;
  
  sVar8 = 2;
  iVar1 = bio_read_full(bio,header,&eof_on_first_read,2);
  if (iVar1 == 0) {
    if (eof_on_first_read == 0) {
      iVar1 = 0xa2;
      line = 0x1df;
    }
    else {
      iVar1 = 0x7b;
      line = 0x1dd;
    }
  }
  else if ((~header[0] & 0x1f) == 0) {
    iVar1 = 0x6d;
    line = 0x1e9;
  }
  else {
    uVar6 = (ulong)header[1];
    if ((short)header._0_2_ < 0) {
      uVar5 = header[1] & 0x7f;
      if (((header._0_2_ & 0x20) != 0) && ((char)uVar5 == '\0')) {
        uVar6 = 0x1002;
        if (max_len < 0x1002) {
          uVar6 = max_len;
        }
        if (1 < max_len) {
          puVar2 = (uint8_t *)OPENSSL_malloc(uVar6);
          *out = puVar2;
          if (puVar2 != (uint8_t *)0x0) {
            *(undefined2 *)puVar2 = header._0_2_;
            while (uVar4 = uVar6 - sVar8, uVar4 != 0) {
              if (0x7ffffffe < uVar4) {
                uVar4 = 0x7fffffff;
              }
              iVar1 = BIO_read((BIO *)bio,*out + sVar8,(int)uVar4);
              if (iVar1 == -1) break;
              if (iVar1 == 0) {
                *out_len = sVar8;
                return 1;
              }
              sVar8 = sVar8 + (long)iVar1;
              if ((uVar6 < max_len) && (uVar6 - sVar8 < 0x800)) {
                uVar4 = uVar6 + 0x1000;
                if (max_len <= uVar6 + 0x1000) {
                  uVar4 = max_len;
                }
                bVar9 = 0xffffffffffffefff < uVar6;
                uVar6 = uVar4;
                if (bVar9) {
                  uVar6 = max_len;
                }
                puVar2 = (uint8_t *)OPENSSL_realloc(*out,uVar6);
                if (puVar2 == (uint8_t *)0x0) break;
                *out = puVar2;
              }
            }
            OPENSSL_free(*out);
          }
        }
        iVar1 = 0xa2;
        line = 0x1f9;
        goto LAB_00169fb2;
      }
      if ((byte)((char)uVar5 - 5U) < 0xfc) {
        iVar1 = 0x6d;
        line = 0x200;
        goto LAB_00169fb2;
      }
      uVar7 = 0;
      iVar1 = bio_read_full(bio,header + 2,(int *)0x0,(ulong)uVar5);
      if (iVar1 == 0) {
        iVar1 = 0xa2;
        line = 0x205;
        goto LAB_00169fb2;
      }
      for (lVar3 = 0; (uint)lVar3 < uVar5; lVar3 = lVar3 + 1) {
        uVar7 = uVar7 << 8 | (uint)header[lVar3 + 2];
      }
      if (uVar7 < 0x80) {
        iVar1 = 0x6d;
        line = 0x212;
        goto LAB_00169fb2;
      }
      if (uVar7 >> (header[1] * '\b' - 8 & 0x1f) == 0) {
        iVar1 = 0x6d;
        line = 0x218;
        goto LAB_00169fb2;
      }
      __n = (ulong)uVar5 + 2;
      uVar6 = (ulong)uVar7;
    }
    else {
      __n = 2;
    }
    if ((uVar6 < 0x80000000) && (sVar8 = __n + uVar6, sVar8 <= max_len)) {
      *out_len = sVar8;
      puVar2 = (uint8_t *)OPENSSL_malloc(sVar8);
      *out = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        return 0;
      }
      memcpy(puVar2,header,__n);
      iVar1 = bio_read_full(bio,*out + __n,(int *)0x0,uVar6);
      if (iVar1 != 0) {
        return 1;
      }
      ERR_put_error(0xc,0,0xa2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                    ,0x22c);
      OPENSSL_free(*out);
      return 0;
    }
    iVar1 = 0xb1;
    line = 0x220;
  }
LAB_00169fb2:
  ERR_put_error(0xc,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                ,line);
  return 0;
}

Assistant:

int BIO_read_asn1(BIO *bio, uint8_t **out, size_t *out_len, size_t max_len) {
  uint8_t header[6];

  static const size_t kInitialHeaderLen = 2;
  int eof_on_first_read;
  if (!bio_read_full(bio, header, &eof_on_first_read, kInitialHeaderLen)) {
    if (eof_on_first_read) {
      // Historically, OpenSSL returned |ASN1_R_HEADER_TOO_LONG| when
      // |d2i_*_bio| could not read anything. CPython conditions on this to
      // determine if |bio| was empty.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    } else {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    }
    return 0;
  }

  const uint8_t tag = header[0];
  const uint8_t length_byte = header[1];

  if ((tag & 0x1f) == 0x1f) {
    // Long form tags are not supported.
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return 0;
  }

  size_t len, header_len;
  if ((length_byte & 0x80) == 0) {
    // Short form length.
    len = length_byte;
    header_len = kInitialHeaderLen;
  } else {
    const size_t num_bytes = length_byte & 0x7f;

    if ((tag & 0x20 /* constructed */) != 0 && num_bytes == 0) {
      // indefinite length.
      if (!bio_read_all(bio, out, out_len, header, kInitialHeaderLen,
                        max_len)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
        return 0;
      }
      return 1;
    }

    if (num_bytes == 0 || num_bytes > 4) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if (!bio_read_full(bio, header + kInitialHeaderLen, NULL, num_bytes)) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
      return 0;
    }
    header_len = kInitialHeaderLen + num_bytes;

    uint32_t len32 = 0;
    for (unsigned i = 0; i < num_bytes; i++) {
      len32 <<= 8;
      len32 |= header[kInitialHeaderLen + i];
    }

    if (len32 < 128) {
      // Length should have used short-form encoding.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if ((len32 >> ((num_bytes - 1) * 8)) == 0) {
      // Length should have been at least one byte shorter.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    len = len32;
  }

  if (len + header_len < len || len + header_len > max_len || len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return 0;
  }
  len += header_len;
  *out_len = len;

  *out = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
  if (*out == NULL) {
    return 0;
  }
  OPENSSL_memcpy(*out, header, header_len);
  if (!bio_read_full(bio, (*out) + header_len, NULL, len - header_len)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    OPENSSL_free(*out);
    return 0;
  }

  return 1;
}